

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

uint strstrip(char *s)

{
  size_t sVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *dest;
  char *last;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(s);
    dest = s + sVar1;
    last = s;
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = false;
      if (((*ppuVar2)[(int)*last] & 0x2000) != 0) {
        bVar3 = *last != '\0';
      }
      if (!bVar3) break;
      last = last + 1;
    }
    while ((last < dest && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)dest[-1]] & 0x2000) != 0)))
    {
      dest = dest + -1;
    }
    *dest = '\0';
    memmove(s,last,(size_t)(dest + (1 - (long)last)));
    s_local._4_4_ = (int)dest - (int)last;
  }
  return s_local._4_4_;
}

Assistant:

static unsigned strstrip(char * s)
{
    char *last = NULL ;
    char *dest = s;

    if (s == NULL) return 0;

    last = s + strlen(s);
    while (isspace((int)*s) && *s) s++;
    while (last > s) {
        if (!isspace((int) * (last - 1)))
            break ;
        last -- ;
    }
    *last = (char)0;

    memmove(dest, s, last - s + 1);
    return last - s;
}